

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  pointer pcVar3;
  ostream *poVar4;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [64];
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  columns;
  SummaryColumn local_a0;
  undefined1 local_60 [64];
  
  sVar1 = (totals->testCases).failed;
  sVar2 = (totals->testCases).failedButOk;
  if ((totals->testCases).passed + sVar1 + sVar2 == 0) {
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_f8._0_8_ = (ulong)(uint7)local_f8._1_7_ << 8;
    Colour::use(ReconstructedExpression);
    std::operator<<(poVar4,"No tests ran\n");
    Colour::~Colour((Colour *)local_f8);
  }
  else if ((sVar2 == 0 && sVar1 == 0) &&
          ((totals->assertions).failed + (totals->assertions).passed !=
           -(totals->assertions).failedButOk)) {
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_f8._0_8_ = (ulong)(uint7)local_f8._1_7_ << 8;
    Colour::use(BrightGreen);
    std::operator<<(poVar4,"All tests passed");
    Colour::~Colour((Colour *)local_f8);
    poVar4 = std::operator<<((this->super_StreamingReporterBase).stream," (");
    pcVar3 = (pointer)(totals->assertions).passed;
    std::__cxx11::string::string((string *)&local_a0,"assertion",(allocator *)&columns);
    local_f8._0_8_ = pcVar3;
    std::__cxx11::string::string((string *)(local_f8 + 8),(string *)&local_a0);
    operator<<(poVar4,(pluralise *)local_f8);
    poVar4 = std::operator<<(poVar4," in ");
    pcVar3 = (pointer)(totals->testCases).passed;
    std::__cxx11::string::string((string *)&local_118,"test case",&local_119);
    local_60._0_8_ = pcVar3;
    std::__cxx11::string::string((string *)(local_60 + 8),(string *)&local_118);
    operator<<(poVar4,(pluralise *)local_60);
    poVar4 = std::operator<<(poVar4,")");
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_118,"",&local_119);
    SummaryColumn::SummaryColumn(&local_a0,&local_118,None);
    SummaryColumn::addRow
              ((SummaryColumn *)local_60,&local_a0,
               (totals->testCases).failed + (totals->testCases).passed +
               (totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)local_f8,(SummaryColumn *)local_60,
               (totals->assertions).failed + (totals->assertions).passed +
               (totals->assertions).failedButOk);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>(&columns,(SummaryColumn *)local_f8);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_f8);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_60);
    SummaryColumn::~SummaryColumn(&local_a0);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string((string *)&local_118,"passed",&local_119);
    SummaryColumn::SummaryColumn(&local_a0,&local_118,Green);
    SummaryColumn::addRow((SummaryColumn *)local_60,&local_a0,(totals->testCases).passed);
    SummaryColumn::addRow
              ((SummaryColumn *)local_f8,(SummaryColumn *)local_60,(totals->assertions).passed);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>(&columns,(SummaryColumn *)local_f8);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_f8);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_60);
    SummaryColumn::~SummaryColumn(&local_a0);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string((string *)&local_118,"failed",&local_119);
    SummaryColumn::SummaryColumn(&local_a0,&local_118,BrightRed);
    SummaryColumn::addRow((SummaryColumn *)local_60,&local_a0,(totals->testCases).failed);
    SummaryColumn::addRow
              ((SummaryColumn *)local_f8,(SummaryColumn *)local_60,(totals->assertions).failed);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>(&columns,(SummaryColumn *)local_f8);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_f8);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_60);
    SummaryColumn::~SummaryColumn(&local_a0);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string((string *)&local_118,"failed as expected",&local_119);
    SummaryColumn::SummaryColumn(&local_a0,&local_118,ReconstructedExpression);
    SummaryColumn::addRow((SummaryColumn *)local_60,&local_a0,(totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)local_f8,(SummaryColumn *)local_60,(totals->assertions).failedButOk)
    ;
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>(&columns,(SummaryColumn *)local_f8);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_f8);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_60);
    SummaryColumn::~SummaryColumn(&local_a0);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string((string *)local_f8,"test cases",(allocator *)local_60);
    printSummaryRow(this,(string *)local_f8,&columns,0);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::string((string *)local_f8,"assertions",(allocator *)local_60);
    printSummaryRow(this,(string *)local_f8,&columns,1);
    std::__cxx11::string::~string((string *)local_f8);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::~vector(&columns);
  }
  return;
}

Assistant:

void printTotals( Totals const& totals ) {
            if( totals.testCases.total() == 0 ) {
                stream << Colour( Colour::Warning ) << "No tests ran\n";
            }
            else if( totals.assertions.total() > 0 && totals.testCases.allPassed() ) {
                stream << Colour( Colour::ResultSuccess ) << "All tests passed";
                stream << " ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")"
                        << "\n";
            }
            else {

                std::vector<SummaryColumn> columns;
                columns.push_back( SummaryColumn( "", Colour::None )
                                        .addRow( totals.testCases.total() )
                                        .addRow( totals.assertions.total() ) );
                columns.push_back( SummaryColumn( "passed", Colour::Success )
                                        .addRow( totals.testCases.passed )
                                        .addRow( totals.assertions.passed ) );
                columns.push_back( SummaryColumn( "failed", Colour::ResultError )
                                        .addRow( totals.testCases.failed )
                                        .addRow( totals.assertions.failed ) );
                columns.push_back( SummaryColumn( "failed as expected", Colour::ResultExpectedFailure )
                                        .addRow( totals.testCases.failedButOk )
                                        .addRow( totals.assertions.failedButOk ) );

                printSummaryRow( "test cases", columns, 0 );
                printSummaryRow( "assertions", columns, 1 );
            }
        }